

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
pstore::sparse_array<std::__cxx11::string,unsigned_int>::
index_impl<pstore::sparse_array<std::__cxx11::string,unsigned_int>&,std::__cxx11::string>
          (sparse_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
           *sa,size_type pos)

{
  uint uVar1;
  size_type sVar2;
  uint mask;
  size_type pos_local;
  sparse_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *sa_local;
  
  sVar2 = sparse_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          ::max_size();
  if (sVar2 <= pos) {
    assert_failed("pos < max_size ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/sparse_array.hpp"
                  ,0x268);
  }
  uVar1 = 1 << ((byte)pos & 0x1f);
  if ((sa->bitmap_ & uVar1) != 0) {
    uVar1 = bit_count::pop_count(sa->bitmap_ & uVar1 - 1);
    return sa->elements_ + uVar1;
  }
  assert_failed("(sa.bitmap_ & mask) != 0U",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/sparse_array.hpp"
                ,0x26a);
}

Assistant:

ResultType & sparse_array<ValueType, BitmapType>::index_impl (SparseArray && sa,
                                                                  size_type pos) noexcept {
        PSTORE_ASSERT (pos < max_size ());
        auto mask = BitmapType{1U} << pos;
        PSTORE_ASSERT ((sa.bitmap_ & mask) != 0U);
        mask--;
        return sa.elements_[bit_count::pop_count (static_cast<BitmapType> (sa.bitmap_ & mask))];
    }